

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_segment_id(AV1_COMP *cpi,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,aom_writer *w,
                     segmentation *seg,segmentation_probs *segp,int skip_txfm)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  MACROBLOCKD *in_RCX;
  AV1_COMMON *in_RDX;
  int *in_RSI;
  long in_RDI;
  int *in_R8;
  long in_R9;
  aom_cdf_prob *pred_cdf;
  int in_stack_00000008;
  int coded_id;
  int mi_col;
  int mi_row;
  uint8_t pred;
  int cdf_num;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffb0;
  int symb;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  int in_stack_ffffffffffffffc4;
  
  if (((char)*in_R8 != '\0') && (*(char *)((long)in_R8 + 1) != '\0')) {
    lVar3 = in_RDI + 0x3bf80;
    bVar1 = av1_get_spatial_seg_pred(in_RDX,in_RCX,in_R8,(int)((ulong)in_R9 >> 0x20));
    uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0);
    symb = *in_RSI;
    if (in_stack_00000008 == 0) {
      iVar2 = av1_neg_interleave((uint)((byte)*(undefined2 *)
                                               ((long)in_RDX->buffer_removal_times + 0x53) & 7),
                                 (uint)bVar1,in_R8[0x29] + 1);
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffc4,uVar4),symb,
                       (aom_cdf_prob *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                       (int)((ulong)(in_R9 + 0x12 + (long)in_stack_ffffffffffffffc4 * 0x12) >> 0x20)
                      );
      set_spatial_segment_id
                ((CommonModeInfoParams *)in_RCX,(uint8_t *)in_R8,(BLOCK_SIZE)((ulong)in_R9 >> 0x38),
                 (int)in_R9,(int)((ulong)lVar3 >> 0x20),(uint8_t)((ulong)lVar3 >> 0x18));
    }
    else {
      set_spatial_segment_id
                ((CommonModeInfoParams *)in_RCX,(uint8_t *)in_R8,(BLOCK_SIZE)((ulong)in_R9 >> 0x38),
                 (int)in_R9,(int)((ulong)lVar3 >> 0x20),(uint8_t)((ulong)lVar3 >> 0x18));
      bVar1 = (byte)((uint)uVar4 >> 0x18);
      set_spatial_segment_id
                ((CommonModeInfoParams *)in_RCX,(uint8_t *)in_R8,(BLOCK_SIZE)((ulong)in_R9 >> 0x38),
                 (int)in_R9,(int)((ulong)lVar3 >> 0x20),(uint8_t)((ulong)lVar3 >> 0x18));
      *(ushort *)((long)in_RDX->buffer_removal_times + 0x53) =
           *(ushort *)((long)in_RDX->buffer_removal_times + 0x53) & 0xfff8 | bVar1 & 7;
    }
  }
  return;
}

Assistant:

static inline void write_segment_id(AV1_COMP *cpi, MACROBLOCKD *const xd,
                                    const MB_MODE_INFO *const mbmi,
                                    aom_writer *w,
                                    const struct segmentation *seg,
                                    struct segmentation_probs *segp,
                                    int skip_txfm) {
  if (!seg->enabled || !seg->update_map) return;

  AV1_COMMON *const cm = &cpi->common;
  int cdf_num;
  const uint8_t pred = av1_get_spatial_seg_pred(
      cm, xd, &cdf_num, cpi->cyclic_refresh->skip_over4x4);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  if (skip_txfm) {
    // Still need to transmit tx size for intra blocks even if skip_txfm is
    // true. Changing segment_id may make the tx size become invalid, e.g
    // changing from lossless to lossy.
    assert(is_inter_block(mbmi) || !cpi->enc_seg.has_lossless_segment);

    set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map, mbmi->bsize,
                           mi_row, mi_col, pred);
    set_spatial_segment_id(&cm->mi_params, cpi->enc_seg.map, mbmi->bsize,
                           mi_row, mi_col, pred);
    /* mbmi is read only but we need to update segment_id */
    ((MB_MODE_INFO *)mbmi)->segment_id = pred;
    return;
  }

  const int coded_id =
      av1_neg_interleave(mbmi->segment_id, pred, seg->last_active_segid + 1);
  aom_cdf_prob *pred_cdf = segp->spatial_pred_seg_cdf[cdf_num];
  aom_write_symbol(w, coded_id, pred_cdf, MAX_SEGMENTS);
  set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map, mbmi->bsize,
                         mi_row, mi_col, mbmi->segment_id);
}